

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  float *pfVar10;
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  __m256 afVar18;
  undefined1 auVar20 [56];
  undefined1 auVar19 [64];
  __m128 afVar21;
  binary_op_pow op;
  __m256 _p1;
  __m256 _p;
  binary_op_pow local_105;
  int local_104;
  void *local_100;
  undefined1 (*local_f8) [16];
  ulong local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  void *local_d0;
  Mat *local_c8;
  Mat *local_c0;
  Mat *local_b8;
  ulong local_b0;
  void *local_a8;
  undefined1 local_a0 [32];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  iVar15 = a->h;
  local_f0 = (ulong)(uint)a->c;
  iVar1 = a->w;
  iVar2 = a->d;
  iVar3 = a->elempack;
  local_c0 = a;
  local_b8 = b;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_f0) {
      local_b0 = 0;
      local_104 = iVar15 * iVar1 * iVar2 * iVar3;
      local_c8 = c;
      do {
        pvVar4 = local_c0->data;
        local_100 = (void *)local_c0->elemsize;
        pvVar5 = local_b8->data;
        pvVar6 = local_c8->data;
        if (local_104 < 8) {
          pfVar10 = (float *)((long)pvVar4 + local_c0->cstep * local_b0 * (long)local_100);
          lVar16 = local_b8->cstep * local_b0 * local_b8->elemsize;
          lVar14 = local_c8->cstep * local_b0 * local_c8->elemsize;
          uVar13 = 0;
        }
        else {
          local_e8 = local_c8->cstep * local_c8->elemsize * local_b0;
          local_f8 = (undefined1 (*) [16])(local_e8 + (long)pvVar6);
          local_e0 = local_b8->cstep * local_b8->elemsize * local_b0;
          local_a8 = (void *)((long)pvVar5 + local_e0);
          local_d8 = local_c0->cstep * (long)local_100 * local_b0;
          local_100 = (void *)((long)pvVar4 + local_d8);
          lVar9 = 0;
          uVar8 = 0;
          local_d0 = pvVar4;
          do {
            pfVar10 = (float *)((long)local_100 + lVar9);
            local_80 = *(float (*) [2])pfVar10;
            afStack_78 = *(float (*) [2])(pfVar10 + 2);
            afStack_70 = *(float (*) [2])(pfVar10 + 4);
            afStack_68._0_8_ = *(undefined8 *)(pfVar10 + 6);
            local_a0 = *(undefined1 (*) [32])((long)local_a8 + lVar9);
            afVar18 = (__m256)local_a0;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                      (&local_105,(__m256 *)local_80,(__m256 *)local_a0);
            *(__m256 *)((long)*local_f8 + lVar9) = afVar18;
            uVar13 = uVar8 + 8;
            iVar15 = uVar8 + 0xf;
            lVar9 = lVar9 + 0x20;
            uVar8 = uVar13;
          } while (iVar15 < local_104);
          lVar14 = local_e8 + lVar9;
          lVar16 = local_e0 + lVar9;
          pfVar10 = (float *)((long)local_d0 + local_d8 + lVar9);
        }
        iVar15 = local_104;
        pauVar12 = (undefined1 (*) [16])((long)pvVar6 + lVar14);
        pauVar11 = (undefined1 (*) [16])((long)pvVar5 + lVar16);
        uVar8 = uVar13 | 3;
        while ((int)uVar8 < iVar15) {
          local_80 = *(float (*) [2])pfVar10;
          afStack_78 = *(float (*) [2])(pfVar10 + 2);
          local_a0._0_16_ = *pauVar11;
          auVar20 = ZEXT856(*(ulong *)(*pauVar11 + 8));
          local_f8 = pauVar12;
          afVar21 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                              (&local_105,(__m128 *)local_80,(__m128 *)local_a0);
          auVar19._0_8_ = afVar21._0_8_;
          auVar19._8_56_ = auVar20;
          *local_f8 = auVar19._0_16_;
          pfVar10 = pfVar10 + 4;
          pauVar11 = pauVar11 + 1;
          pauVar12 = local_f8 + 1;
          uVar8 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if ((int)uVar13 < iVar15) {
          lVar14 = 0;
          do {
            fVar17 = powf(pfVar10[lVar14],*(float *)(*pauVar11 + lVar14 * 4));
            *(float *)((long)*pauVar12 + lVar14 * 4) = fVar17;
            lVar14 = lVar14 + 1;
          } while (iVar15 - uVar13 != (int)lVar14);
        }
        local_b0 = local_b0 + 1;
      } while (local_b0 != local_f0);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}